

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O3

void __thiscall
trng::correlated_normal_dist<double>::param_type::Cholesky_factorization(param_type *this)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  uVar6 = this->d_;
  if (uVar6 != 0) {
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      if (uVar7 == 0) {
        pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar9 = 0.0;
      }
      else {
        pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = 0;
        pdVar3 = pdVar2;
        do {
          dVar9 = 0.0;
          if (uVar4 != 0) {
            uVar5 = 0;
            do {
              dVar9 = dVar9 + *(double *)((long)pdVar2 + uVar5 * 8 + uVar6 * lVar8) * pdVar3[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          pdVar2[uVar6 * uVar7 + uVar4] =
               (pdVar2[uVar6 * uVar7 + uVar4] - dVar9) / pdVar2[uVar4 * (uVar6 + 1)];
          uVar4 = uVar4 + 1;
          pdVar3 = pdVar3 + uVar6;
        } while (uVar4 != uVar7);
        pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar9 = 0.0;
        uVar4 = 0;
        do {
          dVar1 = *(double *)((long)pdVar2 + uVar4 * 8 + uVar6 * lVar8);
          dVar9 = dVar9 + dVar1 * dVar1;
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
      }
      dVar9 = pdVar2[(uVar6 + 1) * uVar7] - dVar9;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = this->d_;
      pdVar2[(uVar6 + 1) * uVar7] = dVar9;
      if (uVar6 <= uVar7 + 1) break;
      memset((void *)((long)pdVar2 + uVar6 * uVar7 * 8 + uVar7 * 8 + 8),0,(~uVar7 + uVar6) * 8);
      lVar8 = lVar8 + 8;
      uVar7 = uVar7 + 1;
    }
  }
  return;
}

Assistant:

void Cholesky_factorization() {
        for (size_type i{0}; i < d_; ++i) {
          for (size_type k{0}; k < i; ++k) {
            result_type t{0};
            for (size_type j{0}; j < k; ++j)
              t += H_[i * d_ + j] * H_[k * d_ + j];
            H_[i * d_ + k] = (H_[i * d_ + k] - t) / H_[k * d_ + k];
          }
          result_type t{0};
          for (size_type j{0}; j < i; ++j)
            t += H_[i * d_ + j] * H_[i * d_ + j];
          H_[i * d_ + i] = trng::math::sqrt(H_[i * d_ + i] - t);
          for (size_type k{i + 1}; k < d_; ++k)
            H_[i * d_ + k] = 0;
        }
      }